

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

FArchive * operator<<(FArchive *arc,splane *p)

{
  FArchive *pFVar1;
  
  pFVar1 = FArchive::operator<<(arc,(double *)p);
  pFVar1 = FArchive::operator<<(pFVar1,&(p->xform).yOffs);
  pFVar1 = FArchive::operator<<(pFVar1,&(p->xform).xScale);
  pFVar1 = FArchive::operator<<(pFVar1,&(p->xform).yScale);
  pFVar1 = operator<<(pFVar1,&(p->xform).Angle);
  pFVar1 = FArchive::operator<<(pFVar1,&(p->xform).baseyOffs);
  pFVar1 = operator<<(pFVar1,&(p->xform).baseAngle);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&p->Flags);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&p->Light);
  pFVar1 = operator<<(pFVar1,&p->Texture);
  pFVar1 = FArchive::operator<<(pFVar1,&p->TexZ);
  FArchive::operator<<(pFVar1,&p->alpha);
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, sector_t::splane &p)
{
	arc << p.xform.xOffs << p.xform.yOffs << p.xform.xScale << p.xform.yScale 
		<< p.xform.Angle << p.xform.baseyOffs << p.xform.baseAngle
		<< p.Flags << p.Light << p.Texture << p.TexZ << p.alpha;
	return arc;
}